

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.cpp
# Opt level: O0

vector<folding_set,_std::allocator<folding_set>_> *
folding_sets_from_folding_info
          (vector<folding_set,_std::allocator<folding_set>_> *__return_storage_ptr__,
          vector<folding_info,_std::allocator<folding_info>_> *in_info)

{
  bool bVar1;
  undefined4 local_90 [2];
  folding_set local_88;
  long local_68;
  int64_t diff;
  folding_info *info;
  const_iterator __end1;
  const_iterator __begin1;
  vector<folding_info,_std::allocator<folding_info>_> *__range1;
  undefined1 auStack_38 [4];
  uint32_t last_match;
  folding_set current;
  vector<folding_info,_std::allocator<folding_info>_> *in_info_local;
  vector<folding_set,_std::allocator<folding_set>_> *result;
  
  current.diff._7_1_ = 0;
  std::vector<folding_set,_std::allocator<folding_set>_>::vector(__return_storage_ptr__);
  memset(auStack_38,0,0x18);
  _auStack_38 = CONCAT44(last_match,2);
  __end1 = std::vector<folding_info,_std::allocator<folding_info>_>::begin(in_info);
  info = (folding_info *)std::vector<folding_info,_std::allocator<folding_info>_>::end(in_info);
  do {
    bVar1 = __gnu_cxx::
            operator==<const_folding_info_*,_std::vector<folding_info,_std::allocator<folding_info>_>_>
                      (&__end1,(__normal_iterator<const_folding_info_*,_std::vector<folding_info,_std::allocator<folding_info>_>_>
                                *)&info);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      if (current._8_8_ != 0) {
        current.mode = __range1._4_4_;
        std::vector<folding_set,_std::allocator<folding_set>_>::push_back
                  (__return_storage_ptr__,(value_type *)auStack_38);
      }
      return __return_storage_ptr__;
    }
    diff = (int64_t)__gnu_cxx::
                    __normal_iterator<const_folding_info_*,_std::vector<folding_info,_std::allocator<folding_info>_>_>
                    ::operator*(&__end1);
    local_68 = (ulong)((reference)diff)->out_codepoint - (ulong)((reference)diff)->in_codepoint;
    if (current._8_8_ == 0) {
      _auStack_38 = CONCAT44(((reference)diff)->in_codepoint,auStack_38);
      __range1._4_4_ = ((reference)diff)->in_codepoint;
      current._8_8_ = local_68;
    }
    else if (auStack_38 == (undefined1  [4])0x2) {
      if ((local_68 == current._8_8_) &&
         (((reference)diff)->in_codepoint == __range1._4_4_ + alternating)) {
        _auStack_38 = (ulong)last_match << 0x20;
        __range1._4_4_ = ((reference)diff)->in_codepoint;
      }
      else {
        if ((local_68 != current._8_8_) ||
           (((reference)diff)->in_codepoint != __range1._4_4_ + single)) goto LAB_0033a37b;
        _auStack_38 = CONCAT44(last_match,1);
        __range1._4_4_ = ((reference)diff)->in_codepoint;
      }
    }
    else {
LAB_0033a37b:
      if (((auStack_38 == (undefined1  [4])0x0) && (current._8_8_ == local_68)) &&
         (__range1._4_4_ + alternating == ((reference)diff)->in_codepoint)) {
        __range1._4_4_ = ((reference)diff)->in_codepoint;
      }
      else if (((auStack_38 == (undefined1  [4])0x1) && (current._8_8_ == local_68)) &&
              (__range1._4_4_ + single == ((reference)diff)->in_codepoint)) {
        __range1._4_4_ = ((reference)diff)->in_codepoint;
      }
      else {
        current.mode = __range1._4_4_;
        std::vector<folding_set,_std::allocator<folding_set>_>::push_back
                  (__return_storage_ptr__,(value_type *)auStack_38);
        memset(local_90,0,0x18);
        local_90[0] = 2;
        current.mode = local_88.mode;
        current.range_start = local_88.range_start;
        _auStack_38 = CONCAT44(*(undefined4 *)diff,2);
        current._8_8_ = local_68;
        __range1._4_4_ = *(mode_type *)diff;
      }
    }
    __gnu_cxx::
    __normal_iterator<const_folding_info_*,_std::vector<folding_info,_std::allocator<folding_info>_>_>
    ::operator++(&__end1);
  } while( true );
}

Assistant:

std::vector<folding_set> folding_sets_from_folding_info(const std::vector<folding_info>& in_info) {
	std::vector<folding_set> result;

	folding_set current{};
	uint32_t last_match;
	for (auto& info : in_info) {
		int64_t diff = static_cast<int64_t>(info.out_codepoint) - static_cast<int64_t>(info.in_codepoint);

		if (current.diff == 0) {
			// this is a new set; set range_start and diff
			current.range_start = info.in_codepoint;
			current.diff = diff;
			last_match = info.in_codepoint;
			continue;
		}

		if (current.mode == folding_set::mode_type::single) {
			// We don't know what mode we are yet; check if this is constant
			if (diff == current.diff
				&& info.in_codepoint == last_match + 1) {
				// diff is same for range_start + 1; must be a constant-diff continuous set
				current.mode = folding_set::mode_type::constant;
				last_match = info.in_codepoint;
				continue;
			}

			// Either one-off fold, or alternating set. Check if in_codepoint is last_match + 2
			if (diff == current.diff
				&& info.in_codepoint == last_match + 2) {
				// Looks like an alternating set
				current.mode = folding_set::mode_type::alternating;
				last_match = info.in_codepoint;
				continue;
			}
		}

		if (current.mode == folding_set::mode_type::constant // For constant offset diffs to continue...
			&& current.diff == diff // Diff must be the same
			&& last_match + 1 == info.in_codepoint) { // And current codepoint must be 1 higher than previous
			// This matches the current range pattern; just update last_match and carry on
			last_match = info.in_codepoint;
			continue;
		}

		if (current.mode == folding_set::mode_type::alternating // For alternating sets to continue...
			&& current.diff == diff // Diff must be same
			&& last_match + 2 == info.in_codepoint) { // And current codepoint must be 2 higher than previous
			last_match = info.in_codepoint;
			continue;
		}

		// This isn't a continuation of the current set; push current and start a new set
		current.range_end = last_match;
		result.push_back(current);

		current = folding_set{};
		current.range_start = info.in_codepoint;
		current.diff = diff;
		last_match = info.in_codepoint;
	}

	// Push final range
	if (current.diff != 0) {
		current.range_end = last_match;
		result.push_back(current);
	}

	return result;
}